

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

void arg_dump_r(cmd_ln_t *cmdln,FILE *fp,arg_t *defn,int32 doc)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *__base;
  ulong uVar5;
  anytype_t *paVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  char **ppcVar10;
  long *plVar11;
  ulong uVar12;
  long local_50;
  ulong local_48;
  
  if (fp == (FILE *)0x0) {
    return;
  }
  ppcVar10 = &defn->deflt;
  local_50 = 0;
  local_48 = 0;
  uVar12 = 0;
  uVar9 = 0;
  while( true ) {
    iVar2 = (int)local_48;
    if (((arg_t *)(ppcVar10 + -2))->name == (char *)0x0) break;
    sVar4 = strlen(((arg_t *)(ppcVar10 + -2))->name);
    if ((int)(uint)uVar12 <= (int)sVar4) {
      uVar12 = sVar4 & 0xffffffff;
    }
    uVar3 = 6;
    if (*ppcVar10 != (char *)0x0) {
      sVar4 = strlen(*ppcVar10);
      uVar3 = (uint)sVar4;
    }
    if ((int)uVar9 <= (int)uVar3) {
      uVar9 = uVar3;
    }
    local_48 = (ulong)(iVar2 + 1);
    local_50 = local_50 + 0x100000000;
    ppcVar10 = ppcVar10 + 4;
  }
  uVar7 = (ulong)((uint)uVar12 & 0xfffffff8);
  fwrite("[NAME]",6,1,(FILE *)fp);
  for (uVar12 = 6; uVar12 < uVar7; uVar12 = uVar12 + 8) {
    fputc(9,(FILE *)fp);
  }
  fwrite("\t[DEFLT]",8,1,(FILE *)fp);
  for (uVar12 = 7; uVar12 < (uVar9 & 0xfffffff8); uVar12 = uVar12 + 8) {
    fputc(9,(FILE *)fp);
  }
  pcVar8 = "\t[DESCR]\n";
  if (doc == 0) {
    pcVar8 = "\t[VALUE]\n";
  }
  fwrite(pcVar8,9,1,(FILE *)fp);
  __base = __ckd_calloc__(local_50 >> 0x20,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x95);
  uVar5 = 0;
  uVar12 = 0;
  if (0 < iVar2) {
    uVar12 = local_48;
  }
  for (; uVar12 != uVar5; uVar5 = uVar5 + 1) {
    *(arg_t **)((long)__base + uVar5 * 8) = defn;
    defn = defn + 1;
  }
  qsort(__base,local_50 >> 0x20,8,cmp_name);
  if (iVar2 < 1) {
    local_48 = 0;
  }
  uVar12 = 0;
  do {
    if (uVar12 == local_48) {
      ckd_free(__base);
      fputc(10,(FILE *)fp);
      return;
    }
    fputs((char *)**(undefined8 **)((long)__base + uVar12 * 8),(FILE *)fp);
    sVar4 = strlen((char *)**(undefined8 **)((long)__base + uVar12 * 8));
    uVar5 = sVar4 - 8;
    do {
      fputc(9,(FILE *)fp);
      uVar5 = uVar5 + 8;
    } while (uVar5 < uVar7);
    pcVar8 = *(char **)(*(long *)((long)__base + uVar12 * 8) + 0x10);
    if (pcVar8 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      fputs(pcVar8,(FILE *)fp);
      sVar4 = strlen(*(char **)(*(long *)((long)__base + uVar12 * 8) + 0x10));
    }
    uVar5 = sVar4 - 8;
    do {
      fputc(9,(FILE *)fp);
      uVar5 = uVar5 + 8;
    } while (uVar5 < (uVar9 & 0xfffffff8));
    puVar1 = *(undefined8 **)((long)__base + uVar12 * 8);
    if (doc == 0) {
      paVar6 = cmd_ln_access_r(cmdln,(char *)*puVar1);
      if (paVar6 != (anytype_t *)0x0) {
        iVar2 = *(int *)(*(long *)((long)__base + uVar12 * 8) + 8);
        switch(iVar2) {
        case 2:
        case 3:
          fprintf((FILE *)fp,"%ld",paVar6->ptr);
          break;
        case 4:
        case 5:
          fprintf((FILE *)fp,"%e",paVar6->ptr);
          break;
        case 6:
        case 7:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
switchD_00104374_caseD_6:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x146,"Unknown argument type: %d\n");
          break;
        case 8:
        case 9:
          pcVar8 = (char *)paVar6->ptr;
          goto LAB_00104324;
        case 0x10:
        case 0x11:
          pcVar8 = "yes";
          if (paVar6->ptr == (void *)0x0) {
            pcVar8 = "no";
          }
          goto LAB_0010432d;
        default:
          if (iVar2 != 0x20) goto switchD_00104374_caseD_6;
          plVar11 = (long *)paVar6->ptr;
          if (plVar11 != (long *)0x0) {
            for (; *plVar11 != 0; plVar11 = plVar11 + 1) {
              fprintf((FILE *)fp,"%s,");
            }
          }
        }
      }
    }
    else {
      pcVar8 = (char *)puVar1[3];
LAB_00104324:
      if (pcVar8 != (char *)0x0) {
LAB_0010432d:
        fputs(pcVar8,(FILE *)fp);
      }
    }
    fputc(10,(FILE *)fp);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void
arg_dump_r(cmd_ln_t *cmdln, FILE *fp, const arg_t * defn, int32 doc)
{
    arg_t const **pos;
    int32 i, n;
    size_t l;
    int32 namelen, deflen;
    anytype_t *vp;
    char const **array;

    /* No definitions, do nothing. */
    if (defn == NULL || fp == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    /*    E_INFO("String length %d. Name length %d, Default Length %d\n",n, namelen, deflen); */
    namelen = namelen & 0xfffffff8;     /* Previous tab position */
    deflen = deflen & 0xfffffff8;       /* Previous tab position */

    fprintf(fp, "[NAME]");
    for (l = strlen("[NAME]"); l < namelen; l += 8)
        fprintf(fp, "\t");
    fprintf(fp, "\t[DEFLT]");
    for (l = strlen("[DEFLT]"); l < deflen; l += 8)
        fprintf(fp, "\t");

    if (doc) {
        fprintf(fp, "\t[DESCR]\n");
    }
    else {
        fprintf(fp, "\t[VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        fprintf(fp, "%s", pos[i]->name);
        for (l = strlen(pos[i]->name); l < namelen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (pos[i]->deflt) {
            fprintf(fp, "%s", pos[i]->deflt);
            l = strlen(pos[i]->deflt);
        }
        else
            l = 0;
        for (; l < deflen; l += 8)
            fprintf(fp, "\t");

        fprintf(fp, "\t");
        if (doc) {
            if (pos[i]->doc)
                fprintf(fp, "%s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    fprintf(fp, "%ld", vp->i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    fprintf(fp, "%e", vp->fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->ptr)
                        fprintf(fp, "%s", (char *)vp->ptr);
                    break;
                case ARG_STRING_LIST:
                    array = (char const**)vp->ptr;
                    if (array)
                        for (l = 0; array[l] != 0; l++) {
                            fprintf(fp, "%s,", array[l]);
                        }
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    fprintf(fp, "%s", vp->i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        fprintf(fp, "\n");
    }
    ckd_free(pos);

    fprintf(fp, "\n");
}